

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall soplex::CLUFactor<double>::initFactorRings(CLUFactor<double> *this)

{
  Pring **p;
  Pring **p_00;
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  pointer pdVar5;
  int *piVar6;
  Pring *pPVar7;
  Pring *pPVar8;
  uint uVar9;
  int iVar10;
  Pring *pPVar11;
  Pring *pPVar12;
  Pring *pPVar13;
  long lVar14;
  long lVar15;
  
  piVar1 = (this->row).perm;
  piVar2 = (this->col).perm;
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&(this->temp).pivot_col,this->thedim + 1);
  p = &(this->temp).pivot_colNZ;
  spx_alloc<soplex::CLUFactor<double>::Pring*>(p,this->thedim + 1);
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&(this->temp).pivot_row,this->thedim + 1);
  p_00 = &(this->temp).pivot_rowNZ;
  spx_alloc<soplex::CLUFactor<double>::Pring*>(p_00,this->thedim + 1);
  uVar9 = this->thedim - (this->temp).stage;
  if (-1 < (int)uVar9) {
    iVar10 = uVar9 + 1;
    pPVar12 = *p_00 + uVar9;
    pPVar11 = *p + uVar9;
    do {
      pPVar11->next = pPVar11;
      pPVar11->prev = pPVar11;
      pPVar12->next = pPVar12;
      pPVar12->prev = pPVar12;
      iVar10 = iVar10 + -1;
      pPVar12 = pPVar12 + -1;
      pPVar11 = pPVar11 + -1;
    } while (0 < iVar10);
  }
  if (0 < this->thedim) {
    piVar3 = (this->u).row.len;
    piVar4 = (this->temp).s_mark;
    pPVar11 = (this->temp).pivot_rowNZ;
    pPVar12 = (this->temp).pivot_row;
    pdVar5 = (this->temp).s_max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->temp).s_cact;
    pPVar7 = (this->temp).pivot_colNZ;
    pPVar13 = (this->temp).pivot_col;
    lVar14 = 0;
    do {
      if (piVar1[lVar14] < 0) {
        lVar15 = (long)piVar3[lVar14];
        if (lVar15 < 1) goto LAB_001dcbd4;
        pPVar8 = pPVar11[lVar15].next;
        pPVar12->next = pPVar8;
        pPVar8->prev = pPVar12;
        pPVar12->prev = pPVar11 + lVar15;
        pPVar11[lVar15].next = pPVar12;
        pPVar12->idx = (int)lVar14;
        pdVar5[lVar14] = -1.0;
      }
      if (piVar2[lVar14] < 0) {
        lVar15 = (long)piVar6[lVar14];
        if (lVar15 < 1) {
LAB_001dcbd4:
          this->stat = SINGULAR;
          return;
        }
        pPVar8 = pPVar7[lVar15].next;
        pPVar13->next = pPVar8;
        pPVar8->prev = pPVar13;
        pPVar13->prev = pPVar7 + lVar15;
        pPVar7[lVar15].next = pPVar13;
        pPVar13->idx = (int)lVar14;
        piVar4[lVar14] = 0;
      }
      lVar14 = lVar14 + 1;
      pPVar13 = pPVar13 + 1;
      pPVar12 = pPVar12 + 1;
    } while (lVar14 < this->thedim);
  }
  return;
}

Assistant:

void CLUFactor<R>::initFactorRings()
{
   int i;
   int* rperm = row.perm;
   int* cperm = col.perm;
   CLUFactor<R>::Pring* ring;

   assert(thedim >= 0);
   spx_alloc(temp.pivot_col,   thedim + 1);
   spx_alloc(temp.pivot_colNZ, thedim + 1);
   spx_alloc(temp.pivot_row,   thedim + 1);
   spx_alloc(temp.pivot_rowNZ, thedim + 1);

   for(i = thedim - temp.stage; i >= 0; --i)
   {
      initDR(temp.pivot_colNZ[i]);
      initDR(temp.pivot_rowNZ[i]);
   }

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0)
      {
         if(u.row.len[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_rowNZ[u.row.len[i]]);

         init2DR(temp.pivot_row[i], *ring);
         temp.pivot_row[i].idx = i;
         temp.s_max[i] = -1;
      }

      if(cperm[i] < 0)
      {
         if(temp.s_cact[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_colNZ[temp.s_cact[i]]);

         init2DR(temp.pivot_col[i], *ring);
         temp.pivot_col[i].idx = i;
         temp.s_mark[i] = 0;
      }
   }
}